

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_Minimum(MinimumForm2 Minimum,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  undefined8 in_RSI;
  code *in_RDI;
  pair<double,_double> pVar5;
  uint32_t i;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer *in_stack_ffffffffffffff50;
  TimerContainer *in_stack_ffffffffffffff60;
  uint local_74;
  BaseTimerContainer *in_stack_ffffffffffffffb0;
  TimerContainer local_40;
  code *pcVar6;
  
  Test_Helper::uniformImages
            ((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
  SetupFunction((string *)0x174163);
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff50);
  local_74 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= local_74) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff60 = &local_40;
    pcVar6 = in_RDI;
    pvVar2 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff60,0);
    pvVar3 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff60,1);
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff60,2);
    (*in_RDI)(pvVar2,pvVar3,pvVar4);
    Performance_Test::TimerContainer::stop(in_stack_ffffffffffffff60);
    local_74 = local_74 + 1;
    in_RDI = pcVar6;
  }
  CleanupFunction((string *)0x17425e);
  pVar5 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffffb0);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x1742a0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff60);
  return pVar5;
}

Assistant:

std::pair < double, double > template_Minimum( MinimumForm2 Minimum, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 3, size, size );

        TEST_FUNCTION_LOOP( Minimum( image[0], image[1], image[2] ), namespaceName )
    }